

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  string local_b8;
  CfdSourceLocation local_98;
  string local_80;
  SchnorrPubkey local_60;
  allocator local_31;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_30;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  SchnorrPubkey *internal_pubkey_local;
  TaprootScriptTree *tree_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  local_30 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       internal_pubkey;
  internal_pubkey_local = (SchnorrPubkey *)tree;
  tree_local._0_4_ = witness_ver;
  tree_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_31);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree
            (&this->script_tree_,(TaprootScriptTree *)internal_pubkey_local);
  Script::Script(&this->redeem_script_);
  GetTargetFormatData(&this->format_data_,local_30,tree_local._4_4_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  SetNetType(this,&this->format_data_);
  TapBranch::GetTweakedPubkey
            (&local_60,(TapBranch *)internal_pubkey_local,(SchnorrPubkey *)network_parameters_local,
             (bool *)0x0);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_60);
  SchnorrPubkey::~SchnorrPubkey(&local_60);
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_80,&this->format_data_);
  CalculateTaproot(this,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x29a;
  local_98.funcname = "Address";
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_b8,&this->format_data_);
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string>
            (&local_98,"call Address({},{},{})",&this->type_,&this->addr_type_,&local_b8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_(),
      format_data_(GetTargetFormatData(network_parameters, type)) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(format_data_.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_,
      format_data_.GetBech32Hrp());
}